

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O2

void __thiscall MemSizeCalculator::calculateFunction(MemSizeCalculator *this,Function *function)

{
  pointer ppVVar1;
  Variable *this_00;
  int iVar2;
  vector<Variable_*,_std::allocator<Variable_*>_> *pvVar3;
  Variable **var;
  pointer ppVVar4;
  
  pvVar3 = Function::getLocalVars(function);
  ppVVar1 = (pvVar3->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar4 = (pvVar3->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppVVar4 != ppVVar1; ppVVar4 = ppVVar4 + 1) {
    iVar2 = calculateVariable(this,*ppVVar4);
    Function::addSize(function,iVar2);
    Variable::setSize(*ppVVar4,iVar2);
    this_00 = *ppVVar4;
    iVar2 = Function::getVariableOffset(function);
    Variable::setOffset(this_00,iVar2);
  }
  iVar2 = Function::getSize(function);
  Function::setOffset(function,iVar2);
  return;
}

Assistant:

void MemSizeCalculator::calculateFunction(Function *function) {
    for (auto &var : function->getLocalVars()) {
        int variableSize = calculateVariable(var);
        function->addSize(variableSize);
        var->setSize(variableSize);
        var->setOffset(function->getVariableOffset());
    }

    function->setOffset(function->getSize());
}